

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::
find<0ul,kj::String&>
          (Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *this,
          char (*params) [7])

{
  uint uVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined8 *in_RDX;
  char *__s2;
  Iterator *__return_storage_ptr__;
  Iterator iter;
  long local_68;
  long local_60;
  Iterator local_58;
  SearchKey local_40;
  char *local_38;
  undefined1 *local_30;
  
  local_30 = (undefined1 *)&local_68;
  local_38 = params[4] + 4;
  local_68 = *(long *)params;
  local_60 = *(long *)(params[1] + 1) - local_68 >> 4;
  local_40._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00236a80;
  __return_storage_ptr__ = &local_58;
  _::BTreeImpl::search(__return_storage_ptr__,(BTreeImpl *)(params[5] + 5),&local_40);
  if ((ulong)local_58.row != 0xe) {
    uVar1 = (local_58.leaf)->rows[local_58.row].i;
    __return_storage_ptr__ = (Iterator *)(ulong)uVar1;
    if (uVar1 != 0) {
      __return_storage_ptr__ = (Iterator *)(ulong)(uVar1 - 1);
      __n = *(size_t *)(local_68 + 8 + (long)__return_storage_ptr__ * 0x10);
      lVar4 = in_RDX[1];
      if (__n == lVar4 + (ulong)(lVar4 == 0)) {
        if (lVar4 == 0) {
          __s2 = "";
        }
        else {
          __s2 = (char *)*in_RDX;
        }
        iVar3 = bcmp(*(void **)(local_68 + (long)__return_storage_ptr__ * 0x10),__s2,__n);
        if (iVar3 == 0) {
          bVar2 = true;
          goto LAB_0016f6fd;
        }
      }
    }
  }
  bVar2 = false;
LAB_0016f6fd:
  lVar4 = 0;
  if (bVar2) {
    lVar4 = (long)__return_storage_ptr__ * 0x10 + *(long *)params;
  }
  *(long *)this = lVar4;
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}